

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGDump(FILE *output,xmlRelaxNGPtr schema)

{
  xmlRelaxNGPtr schema_local;
  FILE *output_local;
  
  if (output != (FILE *)0x0) {
    if (schema == (xmlRelaxNGPtr)0x0) {
      fprintf((FILE *)output,"RelaxNG empty or failed to compile\n");
    }
    else {
      fprintf((FILE *)output,"RelaxNG: ");
      if (schema->doc == (xmlDocPtr)0x0) {
        fprintf((FILE *)output,"no document\n");
      }
      else if (schema->doc->URL == (xmlChar *)0x0) {
        fprintf((FILE *)output,"\n");
      }
      else {
        fprintf((FILE *)output,"%s\n",schema->doc->URL);
      }
      if (schema->topgrammar == (xmlRelaxNGGrammarPtr_conflict)0x0) {
        fprintf((FILE *)output,"RelaxNG has no top grammar\n");
      }
      else {
        xmlRelaxNGDumpGrammar(output,schema->topgrammar,1);
      }
    }
  }
  return;
}

Assistant:

void
xmlRelaxNGDump(FILE * output, xmlRelaxNGPtr schema)
{
    if (output == NULL)
        return;
    if (schema == NULL) {
        fprintf(output, "RelaxNG empty or failed to compile\n");
        return;
    }
    fprintf(output, "RelaxNG: ");
    if (schema->doc == NULL) {
        fprintf(output, "no document\n");
    } else if (schema->doc->URL != NULL) {
        fprintf(output, "%s\n", schema->doc->URL);
    } else {
        fprintf(output, "\n");
    }
    if (schema->topgrammar == NULL) {
        fprintf(output, "RelaxNG has no top grammar\n");
        return;
    }
    xmlRelaxNGDumpGrammar(output, schema->topgrammar, 1);
}